

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_selectable_symbol_text
                  (nk_context *ctx,nk_symbol_type sym,char *str,int len,nk_flags align,
                  nk_bool *value)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var5;
  nk_widget_layout_states nVar6;
  nk_bool nVar7;
  undefined4 in_register_00000034;
  nk_context *i;
  nk_command_buffer *out;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect r;
  nk_rect local_98;
  nk_user_font *local_88;
  undefined8 local_80;
  nk_rect local_78;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  nk_rect local_58;
  nk_rect bounds;
  
  local_80 = CONCAT44(in_register_00000034,sym);
  nVar6 = NK_WIDGET_INVALID;
  if ((((ctx != (nk_context *)0x0) && (pnVar3 = ctx->current, pnVar3 != (nk_window *)0x0)) &&
      (pnVar4 = pnVar3->layout, value != (nk_bool *)0x0 && pnVar4 != (nk_panel *)0x0)) &&
     (nVar6 = nk_widget(&bounds,ctx), nVar6 != NK_WIDGET_INVALID)) {
    i = (nk_context *)0x0;
    if ((nVar6 != NK_WIDGET_ROM) && ((pnVar4->flags & 0x1000) == 0)) {
      i = ctx;
    }
    local_88 = (ctx->style).font;
    local_78.x = bounds.x;
    local_78.y = bounds.y;
    local_78.w = bounds.w;
    local_78.h = bounds.h;
    nVar6 = NK_WIDGET_INVALID;
    if (local_88 != (nk_user_font *)0x0 && (len != 0 && str != (char *)0x0)) {
      iVar2 = *value;
      nVar1 = (ctx->style).selectable.touch_padding;
      local_58.x = bounds.x;
      local_58.y = bounds.y;
      local_58.w = 0.0;
      local_58.h = 0.0;
      fVar8 = nVar1.x;
      r.x = bounds.x - fVar8;
      fVar9 = nVar1.y;
      r.y = bounds.y - fVar9;
      local_68 = bounds.w;
      fStack_64 = bounds.h;
      uStack_60 = 0;
      r.w = fVar8 + fVar8 + bounds.w;
      r.h = fVar9 + fVar9 + bounds.h;
      nVar7 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if (nVar7 != 0) {
        *value = (uint)(*value == 0);
      }
      fVar8 = (ctx->style).selectable.padding.y;
      local_98.h = fStack_64 - (fVar8 + fVar8);
      if ((align & 1) == 0) {
        fVar9 = (ctx->style).selectable.padding.x;
        local_98.x = fVar9 + fVar9 + local_58.x;
      }
      else {
        fVar9 = (ctx->style).selectable.padding.x;
        fVar9 = (local_58.x + local_68) - (fVar9 + fVar9 + local_98.h);
        local_98.x = 0.0;
        if (0.0 <= fVar9) {
          local_98.x = fVar9;
        }
      }
      out = &pnVar3->buffer;
      nVar1 = (ctx->style).selectable.image_padding;
      fVar9 = nVar1.x;
      local_98.x = local_98.x + fVar9;
      fVar10 = nVar1.y;
      local_98.y = local_58.y + fVar8 + fVar10;
      local_98.w = local_98.h - (fVar9 + fVar9);
      local_98.h = local_98.h - (fVar10 + fVar10);
      p_Var5 = (ctx->style).selectable.draw_begin;
      if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var5)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nk_draw_selectable(out,ctx->last_widget_state,&(ctx->style).selectable,*value,&local_78,
                         &local_98,(nk_image *)0x0,(nk_symbol_type)local_80,str,len,align,local_88);
      p_Var5 = (ctx->style).selectable.draw_end;
      if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var5)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nVar6 = (nk_widget_layout_states)(iVar2 != *value);
    }
  }
  return nVar6;
}

Assistant:

NK_API nk_bool
nk_selectable_symbol_text(struct nk_context *ctx, enum nk_symbol_type sym,
const char *str, int len, nk_flags align, nk_bool *value)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;
const struct nk_style *style;

enum nk_widget_layout_states state;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(value);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !value)
return 0;

win = ctx->current;
layout = win->layout;
style = &ctx->style;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_selectable_symbol(&ctx->last_widget_state, &win->buffer, bounds,
str, len, align, value, sym, &style->selectable, in, style->font);
}